

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O3

bool __thiscall
duckdb_re2::RE2::DoMatch
          (RE2 *this,StringPiece *text,Anchor re_anchor,size_t *consumed,Arg **args,int n)

{
  ostringstream *this_00;
  bool bVar1;
  char cVar2;
  StringPiece *submatch;
  ulong uVar3;
  StringPiece *pSVar4;
  uint nsubmatch;
  ulong uVar5;
  StringPiece stkvec [17];
  undefined1 local_1b8 [120];
  ios_base local_140 [272];
  
  if ((*(uint *)&this->field_0x44 & 0x1fffffff) != 0) {
    if ((this->options_).log_errors_ != true) {
      return false;
    }
    this_00 = (ostringstream *)(local_1b8 + 8);
    local_1b8[0] = 0;
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Invalid RE2: ",0xd);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,(this->error_->_M_dataplus)._M_p,this->error_->_M_string_length);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base(local_140);
    return false;
  }
  if (this->num_captures_ < n) {
    return false;
  }
  submatch = (StringPiece *)local_1b8;
  switchD_00569a20::default(submatch,0,0x110);
  nsubmatch = n + 1U;
  if (n == 0) {
    nsubmatch = 0;
  }
  if (consumed != (size_t *)0x0) {
    nsubmatch = n + 1U;
  }
  if ((int)nsubmatch < 0x12) {
    bVar1 = Match(this,text,0,text->size_,re_anchor,submatch,nsubmatch);
    pSVar4 = (StringPiece *)0x0;
    if (!bVar1) {
      return false;
    }
  }
  else {
    submatch = (StringPiece *)operator_new__((ulong)nsubmatch << 4);
    switchD_00569a20::default(submatch,0,(ulong)nsubmatch << 4);
    bVar1 = Match(this,text,0,text->size_,re_anchor,submatch,nsubmatch);
    pSVar4 = submatch;
    if (!bVar1) goto LAB_011bcac4;
  }
  if (consumed != (size_t *)0x0) {
    *consumed = (size_t)(submatch->data_ + (submatch->size_ - (long)text->data_));
  }
  if (args == (Arg **)0x0 || n == 0) {
LAB_011bca7f:
    if (pSVar4 != (StringPiece *)0x0) {
      operator_delete__(pSVar4);
      return true;
    }
    return true;
  }
  uVar5 = 0;
  uVar3 = (ulong)(uint)n;
  if (n < 1) {
    uVar3 = uVar5;
  }
  do {
    if (uVar3 * 8 == uVar5) goto LAB_011bca7f;
    cVar2 = (*(code *)(*(undefined8 **)((long)args + uVar5))[1])
                      (*(undefined8 *)((long)&submatch[1].data_ + uVar5 * 2),
                       *(undefined8 *)((long)&submatch[1].size_ + uVar5 * 2),
                       **(undefined8 **)((long)args + uVar5));
    uVar5 = uVar5 + 8;
  } while (cVar2 != '\0');
  submatch = pSVar4;
  if (pSVar4 == (StringPiece *)0x0) {
    return false;
  }
LAB_011bcac4:
  operator_delete__(submatch);
  return false;
}

Assistant:

bool RE2::DoMatch(const StringPiece& text,
                  Anchor re_anchor,
                  size_t* consumed,
                  const Arg* const* args,
                  int n) const {
  if (!ok()) {
    if (options_.log_errors())
      LOG(ERROR) << "Invalid RE2: " << *error_;
    return false;
  }

  if (NumberOfCapturingGroups() < n) {
    // RE has fewer capturing groups than number of Arg pointers passed in.
    return false;
  }

  // Count number of capture groups needed.
  int nvec;
  if (n == 0 && consumed == NULL)
    nvec = 0;
  else
    nvec = n+1;

  StringPiece* vec;
  StringPiece stkvec[kVecSize];
  StringPiece* heapvec = NULL;

  if (nvec <= static_cast<int>(arraysize(stkvec))) {
    vec = stkvec;
  } else {
    vec = new StringPiece[nvec];
    heapvec = vec;
  }

  if (!Match(text, 0, text.size(), re_anchor, vec, nvec)) {
    delete[] heapvec;
    return false;
  }

  if (consumed != NULL)
    *consumed = static_cast<size_t>(EndPtr(vec[0]) - BeginPtr(text));

  if (n == 0 || args == NULL) {
    // We are not interested in results
    delete[] heapvec;
    return true;
  }

  // If we got here, we must have matched the whole pattern.
  for (int i = 0; i < n; i++) {
    const StringPiece& s = vec[i+1];
    if (!args[i]->Parse(s.data(), s.size())) {
      // TODO: Should we indicate what the error was?
      delete[] heapvec;
      return false;
    }
  }

  delete[] heapvec;
  return true;
}